

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O2

SurfaceVertexVectorQuantity * __thiscall
polyscope::SurfaceMesh::addVertexVectorQuantityImpl
          (SurfaceMesh *this,string *name,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *vectors,VectorType vectorType)

{
  SurfaceVertexVectorQuantity *this_00;
  undefined4 in_register_0000000c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *perm;
  _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  local_60;
  string local_48;
  
  perm = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
         CONCAT44(in_register_0000000c,vectorType);
  this_00 = (SurfaceVertexVectorQuantity *)operator_new(0xd0);
  std::__cxx11::string::string((string *)&local_48,(string *)name);
  applyPermutation<glm::vec<3,float,(glm::qualifier)0>>
            ((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)&local_60,(polyscope *)vectors,
             (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)&this->vertexPerm,perm);
  SurfaceVertexVectorQuantity::SurfaceVertexVectorQuantity
            (this_00,&local_48,
             (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)&local_60,this,vectorType);
  std::
  _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base(&local_60);
  std::__cxx11::string::~string((string *)&local_48);
  QuantityStructure<polyscope::SurfaceMesh>::addQuantity
            (&this->super_QuantityStructure<polyscope::SurfaceMesh>,(QuantityType *)this_00,true);
  return this_00;
}

Assistant:

SurfaceVertexVectorQuantity* SurfaceMesh::addVertexVectorQuantityImpl(std::string name,
                                                                      const std::vector<glm::vec3>& vectors,
                                                                      VectorType vectorType) {
  SurfaceVertexVectorQuantity* q =
      new SurfaceVertexVectorQuantity(name, applyPermutation(vectors, vertexPerm), *this, vectorType);
  addQuantity(q);
  return q;
}